

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_ProgramUsageTest_BaseTest::Run(void)

{
  int iVar1;
  char *__s2;
  FlagSaver fs;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","ProgramUsageTest","BaseTest");
  __s2 = ProgramUsage();
  iVar1 = strcmp("/test/argv/for/gflags_unittest: <useless flag> [...]\nDoes something useless.\n",
                 __s2);
  if (iVar1 == 0) {
    FlagSaver::~FlagSaver(&fs);
    return;
  }
  fprintf(_stderr,"Check failed: streq(%s, %s)\n",
          "\"/test/argv/for/gflags_unittest: \" \"<useless flag> [...]\\nDoes something useless.\\n\""
          ,"ProgramUsage()");
  exit(1);
}

Assistant:

TEST(ProgramUsageTest, BaseTest) {  // Depends on 1st arg to ParseCommandLineFlags()
  EXPECT_STREQ("/test/argv/for/gflags_unittest: "
               "<useless flag> [...]\nDoes something useless.\n",
               ProgramUsage());
}